

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRender.cpp
# Opt level: O3

void __thiscall
vkt::sr::ShaderRenderCaseInstance::computeFragmentReference
          (ShaderRenderCaseInstance *this,Surface *result,QuadGrid *quadGrid)

{
  int iVar1;
  int iVar2;
  Vec4 *pVVar3;
  Vec4 *pVVar4;
  int iVar5;
  int iVar6;
  Vec4 color;
  ShaderEvalContext evalCtx;
  RGBA local_2cc;
  ShaderRenderCaseInstance *local_2c8;
  Vec4 *local_2c0;
  Vec4 local_2b8;
  ShaderEvalContext local_2a0;
  
  iVar1 = result->m_width;
  iVar2 = result->m_height;
  local_2c8 = this;
  ShaderEvalContext::ShaderEvalContext(&local_2a0,quadGrid);
  if (0 < iVar2) {
    pVVar3 = &local_2c8->m_clearColor;
    iVar5 = 0;
    local_2c0 = pVVar3;
    do {
      if (0 < iVar1) {
        iVar6 = 0;
        do {
          ShaderEvalContext::reset
                    (&local_2a0,((float)iVar6 + 0.5) / (float)iVar1,
                     ((float)iVar5 + 0.5) / (float)iVar2);
          (*local_2c8->m_evaluator->_vptr_ShaderEvaluator[2])(local_2c8->m_evaluator,&local_2a0);
          pVVar4 = &local_2a0.color;
          if (local_2a0.isDiscarded != false) {
            pVVar4 = pVVar3;
          }
          local_2b8.m_data._0_8_ = *(undefined8 *)pVVar4->m_data;
          local_2b8.m_data._8_8_ = *(undefined8 *)(pVVar4->m_data + 2);
          tcu::RGBA::RGBA(&local_2cc,&local_2b8);
          *(deUint32 *)
           ((long)(result->m_pixels).m_ptr + (long)(result->m_width * iVar5 + iVar6) * 4) =
               local_2cc.m_value;
          iVar6 = iVar6 + 1;
        } while (iVar1 != iVar6);
      }
      iVar5 = iVar5 + 1;
    } while (iVar5 != iVar2);
  }
  return;
}

Assistant:

void ShaderRenderCaseInstance::computeFragmentReference (tcu::Surface& result, const QuadGrid& quadGrid)
{
	DE_ASSERT(m_evaluator);

	// Buffer info.
	const int			width		= result.getWidth();
	const int			height		= result.getHeight();
	const bool			hasAlpha	= true;  // \todo [2015-09-07 elecro] add correct alpha check
	ShaderEvalContext	evalCtx		(quadGrid);

	// Render.
	for (int y = 0; y < height; y++)
	for (int x = 0; x < width; x++)
	{
		const float sx = ((float)x + 0.5f) / (float)width;
		const float sy = ((float)y + 0.5f) / (float)height;

		evalCtx.reset(sx, sy);
		m_evaluator->evaluate(evalCtx);
		// Select either clear color or computed color based on discarded bit.
		tcu::Vec4 color = evalCtx.isDiscarded ? m_clearColor : evalCtx.color;

		if (!hasAlpha)
			color.w() = 1.0f;

		result.setPixel(x, y, tcu::RGBA(color));
	}
}